

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O3

QStringView qvariant_cast<QStringView>(QVariant *v)

{
  undefined4 *puVar1;
  PrivateShared *pPVar2;
  QStringView QVar3;
  bool bVar4;
  QMetaType fromType;
  long in_FS_OFFSET;
  QMetaType local_38;
  QMetaType local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QStringView>::metaType;
  local_38.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar4 = comparesEqual(&local_38,&local_30);
  if (bVar4) {
    if (((v->d).field_0x18 & 1) == 0) {
      local_28 = *(undefined4 *)&(v->d).data;
      uStack_24 = *(undefined4 *)((long)&(v->d).data + 4);
      uStack_20 = *(undefined4 *)((long)&(v->d).data + 8);
      uStack_1c = *(undefined4 *)((long)&(v->d).data + 0xc);
    }
    else {
      pPVar2 = (v->d).data.shared;
      puVar1 = (undefined4 *)
               ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar2->offset);
      local_28 = *puVar1;
      uStack_24 = puVar1[1];
      uStack_20 = puVar1[2];
      uStack_1c = puVar1[3];
    }
  }
  else {
    local_28 = 0;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    fromType = QVariant::metaType(v);
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar2 = (v->d).data.shared;
      v = (QVariant *)
          ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int> + (long)pPVar2->offset);
    }
    QMetaType::convert(fromType,v,local_30,&local_28);
  }
  QVar3.m_size._4_4_ = uStack_24;
  QVar3.m_size._0_4_ = local_28;
  QVar3.m_data._0_4_ = uStack_20;
  QVar3.m_data._4_4_ = uStack_1c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return QVar3;
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}